

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_packusdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  undefined1 auVar15 [16];
  ushort uVar16;
  undefined1 auVar17 [16];
  ushort uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar1 = d->_l_ZMMReg[0];
  uVar2 = d->_l_ZMMReg[1];
  uVar3 = d->_l_ZMMReg[2];
  uVar4 = d->_l_ZMMReg[3];
  uVar5 = s->_l_ZMMReg[0];
  uVar6 = s->_l_ZMMReg[1];
  uVar7 = s->_l_ZMMReg[2];
  uVar8 = s->_l_ZMMReg[3];
  auVar20._0_4_ = -(uint)((int)uVar5 < 0);
  auVar20._4_4_ = -(uint)((int)uVar6 < 0);
  auVar20._8_4_ = -(uint)((int)uVar7 < 0);
  auVar20._12_4_ = -(uint)((int)uVar8 < 0);
  auVar15._0_4_ = -(uint)((int)uVar1 < 0);
  auVar15._4_4_ = -(uint)((int)uVar2 < 0);
  auVar15._8_4_ = -(uint)((int)uVar3 < 0);
  auVar15._12_4_ = -(uint)((int)uVar4 < 0);
  auVar15 = packssdw(auVar15,auVar20);
  uVar18 = -(ushort)((int)(uVar1 ^ 0x80000000) < -0x7fff0001);
  uVar12 = -(ushort)((int)(uVar2 ^ 0x80000000) < -0x7fff0001);
  uVar13 = -(ushort)((int)(uVar3 ^ 0x80000000) < -0x7fff0001);
  uVar14 = -(ushort)((int)(uVar4 ^ 0x80000000) < -0x7fff0001);
  uVar16 = -(ushort)((int)(uVar5 ^ 0x80000000) < -0x7fff0001);
  uVar9 = -(ushort)((int)(uVar6 ^ 0x80000000) < -0x7fff0001);
  uVar10 = -(ushort)((int)(uVar7 ^ 0x80000000) < -0x7fff0001);
  uVar11 = -(ushort)((int)(uVar8 ^ 0x80000000) < -0x7fff0001);
  auVar17._0_4_ = (int)(short)(uVar16 & (ushort)uVar5 | uVar16 ^ 0xffff);
  auVar17._4_4_ = (int)(short)(uVar9 & (ushort)uVar6 | uVar9 ^ 0xffff);
  auVar17._8_4_ = (int)(short)(uVar10 & (ushort)uVar7 | uVar10 ^ 0xffff);
  auVar17._12_4_ = (int)(short)(uVar11 & (ushort)uVar8 | uVar11 ^ 0xffff);
  auVar19._0_4_ = (int)(short)(uVar18 ^ 0xffff | (ushort)uVar1 & uVar18);
  auVar19._4_4_ = (int)(short)(uVar12 ^ 0xffff | (ushort)uVar2 & uVar12);
  auVar19._8_4_ = (int)(short)(uVar13 ^ 0xffff | (ushort)uVar3 & uVar13);
  auVar19._12_4_ = (int)(short)(uVar14 ^ 0xffff | (ushort)uVar4 & uVar14);
  auVar20 = packssdw(auVar19,auVar17);
  *(undefined1 (*) [16])d = ~auVar15 & auVar20;
  return;
}

Assistant:

void glue(helper_packusdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satuw((int32_t) d->L(0));
    r.W(1) = satuw((int32_t) d->L(1));
    r.W(2) = satuw((int32_t) d->L(2));
    r.W(3) = satuw((int32_t) d->L(3));
    r.W(4) = satuw((int32_t) s->L(0));
    r.W(5) = satuw((int32_t) s->L(1));
    r.W(6) = satuw((int32_t) s->L(2));
    r.W(7) = satuw((int32_t) s->L(3));
    *d = r;
}